

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O1

BOOL __thiscall LASinterval::get_cell(LASinterval *this,I32 c_index)

{
  ulong uVar1;
  long *plVar2;
  long lVar3;
  LASintervalCell *pLVar4;
  ulong uVar5;
  long *plVar6;
  long *plVar7;
  
  uVar1 = *(ulong *)((long)this->cells + 8);
  uVar5 = (ulong)(long)c_index % uVar1;
  plVar6 = *(long **)(*this->cells + uVar5 * 8);
  plVar7 = (long *)0x0;
  if ((plVar6 != (long *)0x0) &&
     (plVar2 = (long *)*plVar6, plVar7 = plVar6, *(int *)((long *)*plVar6 + 1) != c_index)) {
    while (plVar6 = plVar2, plVar2 = (long *)*plVar6, plVar2 != (long *)0x0) {
      plVar7 = (long *)0x0;
      if (((ulong)(long)(int)plVar2[1] % uVar1 != uVar5) ||
         (plVar7 = plVar6, (int)plVar2[1] == c_index)) goto LAB_00121f5a;
    }
    plVar7 = (long *)0x0;
  }
LAB_00121f5a:
  if (plVar7 == (long *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = *plVar7;
  }
  if (lVar3 == 0) {
    pLVar4 = (LASintervalCell *)0x0;
  }
  else {
    this->index = *(I32 *)(lVar3 + 8);
    pLVar4 = *(LASintervalCell **)(lVar3 + 0x10);
    this->full = pLVar4[1].start;
    this->total = pLVar4[1].end;
  }
  this->current_cell = pLVar4;
  return lVar3 != 0;
}

Assistant:

BOOL LASinterval::get_cell(const I32 c_index)
{
  my_cell_hash::iterator hash_element = ((my_cell_hash*)cells)->find(c_index);
  if (hash_element == ((my_cell_hash*)cells)->end())
  {
    current_cell = 0;
    return FALSE;
  }
  index = (*hash_element).first;
  full = (*hash_element).second->full;
  total = (*hash_element).second->total;
  current_cell = (*hash_element).second;
  return TRUE;
}